

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

void clask::serve_dir(response_writer *resp,request *req,string *path)

{
  bool bVar1;
  path *this;
  ostream *poVar2;
  allocator<char> local_3f9;
  string local_3f8 [39];
  allocator<char> local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390;
  string local_370;
  path local_350;
  undefined1 local_328 [8];
  string fn;
  directory_entry *e;
  undefined1 local_2f0 [8];
  directory_iterator __end1;
  undefined1 local_2d0 [8];
  directory_iterator __begin1;
  directory_iterator local_298;
  directory_iterator *local_288;
  directory_iterator *__range1;
  string local_278 [32];
  string local_258 [32];
  string local_238;
  long local_218;
  ostringstream os;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  clask local_40 [8];
  wstring wpath;
  string *path_local;
  request *req_local;
  response_writer *resp_local;
  
  to_wstring(local_40,path);
  resp->code = 200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"content-type",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"text/html; charset=utf-8",&local_99);
  response_writer::set_header(resp,&local_60,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_218);
  std::operator<<((ostream *)&local_218,
                  "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>");
  html_encode(&local_238,&req->uri);
  std::operator<<((ostream *)&local_218,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::operator<<((ostream *)&local_218,"</title>\n</head>\n<body>\n");
  std::__cxx11::ostringstream::str();
  (**resp->_vptr_response_writer)(resp,local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"",(allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::ostringstream::str((string *)&local_218);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::ios::clear((int)&local_218 + (int)*(undefined8 *)(local_218 + -0x18));
  std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
            ((path *)&__begin1._M_dir._M_refcount,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_40,
             auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_298,(path *)&__begin1._M_dir._M_refcount);
  std::filesystem::__cxx11::path::~path((path *)&__begin1._M_dir._M_refcount);
  local_288 = &local_298;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount,local_288);
  std::filesystem::__cxx11::begin
            ((__cxx11 *)local_2d0,(directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)&__end1._M_dir._M_refcount);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&e,local_288);
  std::filesystem::__cxx11::end((directory_iterator *)local_2f0);
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)&e);
  while (bVar1 = std::filesystem::__cxx11::operator!=
                           ((directory_iterator *)local_2d0,(directory_iterator *)local_2f0), bVar1)
  {
    fn.field_2._8_8_ =
         std::filesystem::__cxx11::directory_iterator::operator*((directory_iterator *)local_2d0);
    this = std::filesystem::__cxx11::directory_entry::path((directory_entry *)fn.field_2._8_8_);
    std::filesystem::__cxx11::path::filename(&local_350,this);
    std::filesystem::__cxx11::path::string((string *)local_328,&local_350);
    std::filesystem::__cxx11::path::~path(&local_350);
    bVar1 = std::filesystem::__cxx11::directory_entry::is_directory
                      ((directory_entry *)fn.field_2._8_8_);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)local_328,"/");
    }
    poVar2 = std::operator<<((ostream *)&local_218,"<a href=\"");
    url_encode(&local_370,(string *)local_328,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_370);
    poVar2 = std::operator<<(poVar2,"\">");
    html_encode(&local_390,(string *)local_328);
    poVar2 = std::operator<<(poVar2,(string *)&local_390);
    std::operator<<(poVar2,"</a></br>\n");
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::ostringstream::str();
    (**resp->_vptr_response_writer)(resp,local_3b0);
    std::__cxx11::string::~string(local_3b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3d0,"",&local_3d1);
    std::__cxx11::ostringstream::str((string *)&local_218);
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    std::ios::clear((int)&local_218 + (int)*(undefined8 *)(local_218 + -0x18));
    std::__cxx11::string::~string((string *)local_328);
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_2d0);
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_2f0)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)local_2d0)
  ;
  std::filesystem::__cxx11::directory_iterator::~directory_iterator(&local_298);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"</body>\n</html>\n",&local_3f9);
  (**resp->_vptr_response_writer)(resp,local_3f8);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_218);
  std::__cxx11::wstring::~wstring((wstring *)local_40);
  return;
}

Assistant:

inline void serve_dir(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);

  resp.code = 200;
  resp.set_header("content-type", "text/html; charset=utf-8");
  std::ostringstream os;
  os << "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>";
  os << html_encode(req.uri);
  os << "</title>\n</head>\n<body>\n";
  resp.write(os.str());
  os.str("");
  os.clear(std::stringstream::goodbit);

  for (const auto& e : std::filesystem::directory_iterator(wpath)) {
    auto fn = e.path().filename().string();
    if (e.is_directory()) fn += "/";
    os << "<a href=\"" << url_encode(fn, false) << "\">" << html_encode(fn) << "</a></br>\n";
    resp.write(os.str());
    os.str("");
    os.clear(std::stringstream::goodbit);
  }
  resp.write("</body>\n</html>\n");
}